

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  
  if (factor != 1) {
    if (factor == 0) {
      if (0 < this->used_digits_) {
        puVar1 = (this->bigits_).start_;
        lVar4 = 0;
        do {
          puVar1[lVar4] = 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->used_digits_);
      }
      this->used_digits_ = 0;
      this->exponent_ = 0;
    }
    else if (this->used_digits_ != 0) {
      if (this->used_digits_ < 1) {
        uVar3 = 0;
      }
      else {
        puVar1 = (this->bigits_).start_;
        lVar4 = 0;
        uVar3 = 0;
        do {
          uVar3 = (ulong)puVar1[lVar4] * (ulong)factor + uVar3;
          puVar1[lVar4] = (uint)uVar3 & 0xfffffff;
          uVar3 = uVar3 >> 0x1c;
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->used_digits_);
      }
      if (uVar3 != 0) {
        puVar1 = (this->bigits_).start_;
        do {
          if (0x7f < (long)this->used_digits_) {
            abort();
          }
          puVar1[this->used_digits_] = (uint)uVar3 & 0xfffffff;
          this->used_digits_ = this->used_digits_ + 1;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}